

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_composite_constants(CompilerHLSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  Variant *pVVar3;
  SPIRConstant *c;
  SPIRType *pSVar4;
  bool bVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  string name;
  LoopLock LStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_98);
  }
  else {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[3].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar1 = pTVar6 + sVar2;
    bVar5 = false;
    do {
      while( true ) {
        pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (((pVVar3[pTVar6->id].type == TypeConstant) &&
            (c = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + pTVar6->id),
            c->specialization == false)) &&
           ((pSVar4 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(c->super_IVariant).field_0xc),
            *(int *)&(pSVar4->super_IVariant).field_0xc == 0xf ||
            ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0)))) break;
        pTVar6 = pTVar6 + 1;
        if (pTVar6 == pTVar1) {
          ParsedIR::LoopLock::~LoopLock(&LStack_98);
          if (!bVar5) {
            return;
          }
          goto LAB_002118bb;
        }
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_50,this,(ulong)(c->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1a])
                (&local_90,this,pSVar4,local_50,0);
      CompilerGLSL::constant_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,c);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_90,
                 (char (*) [4])0x2f38c7,&local_70,(char (*) [2])0x2d9bde);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pTVar6 = pTVar6 + 1;
      bVar5 = true;
    } while (pTVar6 != pTVar1);
    ParsedIR::LoopLock::~LoopLock(&LStack_98);
LAB_002118bb:
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2d80a2);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_composite_constants()
{
	// HLSL cannot declare structs or arrays inline, so we must move them out to
	// global constants directly.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		if (type.basetype == SPIRType::Struct || !type.array.empty())
		{
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}